

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_WriteString(BCWriterState *s,JSString *p)

{
  undefined8 uVar1;
  ulong uVar2;
  
  dbuf_put_leb128(&s->dbuf,*(int *)&p->field_0x4 << 1 | (uint)(*(int *)&p->field_0x4 < 0));
  uVar1 = *(undefined8 *)&p->field_0x4;
  if (-1 < (int)(uint)uVar1) {
    dbuf_put(&s->dbuf,(uint8_t *)(p + 1),(ulong)((uint)uVar1 & 0x7fffffff));
    return;
  }
  for (uVar2 = 0; uVar2 < ((uint)uVar1 & 0x7fffffff); uVar2 = uVar2 + 1) {
    bc_put_u16(s,*(uint16_t *)((long)&p[1].header.ref_count + uVar2 * 2));
    uVar1 = *(undefined8 *)&p->field_0x4;
  }
  return;
}

Assistant:

static void JS_WriteString(BCWriterState *s, JSString *p)
{
    int i;
    bc_put_leb128(s, ((uint32_t)p->len << 1) | p->is_wide_char);
    if (p->is_wide_char) {
        for(i = 0; i < p->len; i++)
            bc_put_u16(s, p->u.str16[i]);
    } else {
        dbuf_put(&s->dbuf, p->u.str8, p->len);
    }
}